

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O2

void SetMaterialColorProperty
               (vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *param_2,TexProperty prop,
               aiMaterial *mat,aiTextureType texType,char *pKey,uint type,uint idx)

{
  int number;
  Texture *pTVar1;
  vector<glTF::Image_*,_std::allocator<glTF::Image_*>_> *pvVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  size_t __n;
  aiString uri;
  
  if (prop.texture.vector == (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0) {
    uri._0_8_ = prop.color._0_8_;
    uri.data._4_8_ = prop.color._8_8_;
    aiMaterial::AddProperty(mat,(aiColor4D *)&uri,1,pKey,type,idx);
  }
  else {
    pTVar1 = ((prop.texture.vector)->
             super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
             super__Vector_impl_data._M_start[prop.texture.index];
    pvVar2 = (pTVar1->source).vector;
    if (pvVar2 != (vector<glTF::Image_*,_std::allocator<glTF::Image_*>_> *)0x0) {
      uVar6 = (ulong)(pTVar1->source).index;
      lVar3 = *(long *)(*(long *)&(pvVar2->
                                  super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>)
                                  ._M_impl + uVar6 * 8);
      uVar4 = *(ulong *)(lVar3 + 0x50);
      __n = 0x3ff;
      if ((uVar4 & 0xfffffc00) == 0) {
        __n = uVar4 & 0xffffffff;
      }
      uri.length = (ai_uint32)__n;
      memcpy(uri.data,*(void **)(lVar3 + 0x48),__n);
      uri.data[__n] = '\0';
      number = (embeddedTexIdxs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      if (number != -1) {
        uri.data[0] = '*';
        uVar5 = Assimp::ASSIMP_itoa10(uri.data + 1,0x3ff,number);
        uri.length = uVar5 + 1;
      }
      aiMaterial::AddProperty(mat,&uri,"$tex.file",texType,0);
    }
  }
  return;
}

Assistant:

inline
void SetMaterialColorProperty(std::vector<int>& embeddedTexIdxs, Asset& /*r*/, glTF::TexProperty prop, aiMaterial* mat,
        aiTextureType texType, const char* pKey, unsigned int type, unsigned int idx) {
    if (prop.texture) {
        if (prop.texture->source) {
            aiString uri(prop.texture->source->uri);

            int texIdx = embeddedTexIdxs[prop.texture->source.GetIndex()];
            if (texIdx != -1) { // embedded
                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture)
                uri.data[0] = '*';
                uri.length = 1 + ASSIMP_itoa10(uri.data + 1, MAXLEN - 1, texIdx);
            }

            mat->AddProperty(&uri, _AI_MATKEY_TEXTURE_BASE, texType, 0);
        }
    } else {
        aiColor4D col;
        CopyValue(prop.color, col);
        mat->AddProperty(&col, 1, pKey, type, idx);
    }
}